

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

bool_t utilOnExit(_func_void_varargs *fn)

{
  bool_t bVar1;
  util_onexit_t *blob;
  size_t sVar2;
  util_onexit_t in_RDI;
  blob_t b;
  _func_void_varargs *in_stack_ffffffffffffffc8;
  size_t *in_stack_ffffffffffffffd0;
  blob_t in_stack_ffffffffffffffd8;
  bool_t local_4;
  
  bVar1 = mtCallOnce(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if ((bVar1 == 0) || (_inited == 0)) {
    local_4 = 0;
  }
  else {
    mtMtxLock((mt_mtx_t *)0x12bdd3);
    blobSize(_fns);
    blob = (util_onexit_t *)blobResize(in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
    if (blob == (util_onexit_t *)0x0) {
      mtMtxUnlock((mt_mtx_t *)0x12be15);
      local_4 = 0;
    }
    else {
      _fns = blob;
      sVar2 = blobSize(blob);
      blob[(sVar2 >> 3) - 1] = in_RDI;
      mtMtxUnlock((mt_mtx_t *)0x12be72);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

bool_t utilOnExit(void (*fn)())
{
	blob_t b;
	// инициализировать однократно
	if (!mtCallOnce(&_once, utilOnExitInit) || !_inited)
		return FALSE;
	// расширить список
	mtMtxLock(_mtx);
	ASSERT(blobIsValid(_fns));
	b = blobResize(_fns, blobSize(_fns) + sizeof(util_onexit_t));
	if (!b)
	{
		mtMtxUnlock(_mtx);
		return FALSE;
	}
	ASSERT(blobSize(_fns) % sizeof(util_onexit_t) == 0);
	_fns = (util_onexit_t*)b;
	// добавить функцию
	_fns[blobSize(_fns) / sizeof(util_onexit_t) - 1] = fn;
	mtMtxUnlock(_mtx);
	return TRUE;
}